

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hcompress.c
# Opt level: O0

void qtree_onebit(int *a,int n,int nx,int ny,uchar *b,int bit)

{
  uint uVar1;
  byte bVar2;
  int local_50;
  int local_4c;
  int s00;
  int s10;
  int b3;
  int b2;
  int b1;
  int b0;
  int k;
  int j;
  int i;
  int bit_local;
  uchar *b_local;
  int ny_local;
  int nx_local;
  int n_local;
  int *a_local;
  
  bVar2 = (byte)bit;
  uVar1 = 1 << (bVar2 & 0x1f);
  b1 = 0;
  for (k = 0; k < nx + -1; k = k + 2) {
    local_50 = n * k;
    local_4c = local_50 + n;
    for (b0 = 0; b0 < ny + -1; b0 = b0 + 2) {
      b[b1] = (uchar)((int)(a[local_4c + 1] & uVar1 | (a[local_4c] & uVar1) << 1 |
                            (a[local_50 + 1] & uVar1) << 2 | (a[local_50] & uVar1) << 3) >>
                     (bVar2 & 0x1f));
      b1 = b1 + 1;
      local_50 = local_50 + 2;
      local_4c = local_4c + 2;
    }
    if (b0 < ny) {
      b[b1] = (uchar)((int)((a[local_4c] & uVar1) << 1 | (a[local_50] & uVar1) << 3) >>
                     (bVar2 & 0x1f));
      b1 = b1 + 1;
    }
  }
  if (k < nx) {
    local_50 = n * k;
    for (b0 = 0; b0 < ny + -1; b0 = b0 + 2) {
      b[b1] = (uchar)((int)((a[local_50 + 1] & uVar1) << 2 | (a[local_50] & uVar1) << 3) >>
                     (bVar2 & 0x1f));
      b1 = b1 + 1;
      local_50 = local_50 + 2;
    }
    if (b0 < ny) {
      b[b1] = (uchar)((int)((a[local_50] & uVar1) << 3) >> (bVar2 & 0x1f));
    }
  }
  return;
}

Assistant:

static void
qtree_onebit(int a[], int n, int nx, int ny, unsigned char b[], int bit)
{
int i, j, k;
int b0, b1, b2, b3;
int s10, s00;

	/*
	 * use selected bit to get amount to shift
	 */
	b0 = 1<<bit;
	b1 = b0<<1;
	b2 = b0<<2;
	b3 = b0<<3;
	k = 0;							/* k is index of b[i/2,j/2]	*/
	for (i = 0; i<nx-1; i += 2) {
		s00 = n*i;					/* s00 is index of a[i,j]	*/
/* tried using s00+n directly in the statements, but this had no effect on performance */
		s10 = s00+n;				/* s10 is index of a[i+1,j]	*/
		for (j = 0; j<ny-1; j += 2) {

/*
 this was not any faster..
 
         b[k] = (a[s00]  & b0) ? 
	            (a[s00+1] & b0) ?
	                (a[s10] & b0)   ?
		            (a[s10+1] & b0) ? 15 : 14
                         :  (a[s10+1] & b0) ? 13 : 12
		      : (a[s10] & b0)   ?
		            (a[s10+1] & b0) ? 11 : 10
                         :  (a[s10+1] & b0) ?  9 :  8
	          : (a[s00+1] & b0) ?
	                (a[s10] & b0)   ?
		            (a[s10+1] & b0) ? 7 : 6
                         :  (a[s10+1] & b0) ? 5 : 4

		      : (a[s10] & b0)   ?
		            (a[s10+1] & b0) ? 3 : 2
                         :  (a[s10+1] & b0) ? 1 : 0;
*/

/*
this alternative way of calculating b[k] was slowwer than the original code
		    if ( a[s00]     & b0)
			if ( a[s00+1]     & b0)
			    if ( a[s10]     & b0)
				if ( a[s10+1]     & b0)
					b[k] = 15;
				else
					b[k] = 14;
			    else
				if ( a[s10+1]     & b0)
					b[k] = 13;
				else
					b[k] = 12;
			else
			    if ( a[s10]     & b0)
				if ( a[s10+1]     & b0)
					b[k] = 11;
				else
					b[k] = 10;
			    else
				if ( a[s10+1]     & b0)
					b[k] = 9;
				else
					b[k] = 8;
		    else
			if ( a[s00+1]     & b0)
			    if ( a[s10]     & b0)
				if ( a[s10+1]     & b0)
					b[k] = 7;
				else
					b[k] = 6;
			    else
				if ( a[s10+1]     & b0)
					b[k] = 5;
				else
					b[k] = 4;
			else
			    if ( a[s10]     & b0)
				if ( a[s10+1]     & b0)
					b[k] = 3;
				else
					b[k] = 2;
			    else
				if ( a[s10+1]     & b0)
					b[k] = 1;
				else
					b[k] = 0;
*/
			


			b[k] = ( ( a[s10+1]     & b0)
				   | ((a[s10  ]<<1) & b1)
				   | ((a[s00+1]<<2) & b2)
				   | ((a[s00  ]<<3) & b3) ) >> bit;

			k += 1;
			s00 += 2;
			s10 += 2;
		}
		if (j < ny) {
			/*
			 * row size is odd, do last element in row
			 * s00+1,s10+1 are off edge
			 */
			b[k] = ( ((a[s10  ]<<1) & b1)
				   | ((a[s00  ]<<3) & b3) ) >> bit;
			k += 1;
		}
	}
	if (i < nx) {
		/*
		 * column size is odd, do last row
		 * s10,s10+1 are off edge
		 */
		s00 = n*i;
		for (j = 0; j<ny-1; j += 2) {
			b[k] = ( ((a[s00+1]<<2) & b2)
				   | ((a[s00  ]<<3) & b3) ) >> bit;
			k += 1;
			s00 += 2;
		}
		if (j < ny) {
			/*
			 * both row and column size are odd, do corner element
			 * s00+1, s10, s10+1 are off edge
			 */
			b[k] = ( ((a[s00  ]<<3) & b3) ) >> bit;
			k += 1;
		}
	}
}